

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

void assert_version_id(char **qq,size_t *ss)

{
  char cVar1;
  ulong uVar2;
  void *in_R8;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = *qq;
  uVar2 = *ss;
  pcVar4 = pcVar3;
  if (uVar2 != 0) {
    pcVar4 = pcVar3 + uVar2;
    do {
      cVar1 = *pcVar3;
      if (cVar1 != '.' && 9 < (byte)(cVar1 - 0x30U)) goto LAB_00103b08;
      pcVar3 = pcVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  cVar1 = *pcVar4;
  uVar2 = 0;
  pcVar3 = pcVar4;
LAB_00103b08:
  if (((cVar1 == 'd') && (cVar1 = 'd', pcVar3[1] == 'e')) && (pcVar3[2] == 'v')) {
    uVar2 = uVar2 - 3;
    cVar1 = pcVar3[3];
    pcVar3 = pcVar3 + 3;
  }
  pcVar3 = pcVar3 + ((byte)(cVar1 + 0x9fU) < 4);
  failure("No space after version: ``%s\'\'",pcVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॕ',(uint)(1 < uVar2),"s > 1",in_R8);
  failure("No space after version: ``%s\'\'",pcVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॗ',(uint)(*pcVar3 == ' '),"*q == \' \'",in_R8);
  *qq = pcVar3 + 1;
  *ss = uVar2 - 1;
  return;
}

Assistant:

static void assert_version_id(char **qq, size_t *ss)
{
	char *q = *qq;
	size_t s = *ss;

	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}

	if (q[0] == 'd' && q[1] == 'e' && q[2] == 'v') {
		q += 3;
		s -= 3;
	}

	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;

	/* Version number terminated by space. */
	failure("No space after version: ``%s''", q);
	assert(s > 1);
	failure("No space after version: ``%s''", q);
	assert(*q == ' ');

	++q; --s;

	*qq = q;
	*ss = s;
}